

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O3

ngx_int_t ngx_http_fastcgi_script_name_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_http_fastcgi_loc_conf_t *flcf;
  size_t sVar1;
  ngx_http_fastcgi_ctx_t *pnVar2;
  u_char *__dest;
  uint uVar3;
  ngx_int_t nVar4;
  
  flcf = (ngx_http_fastcgi_loc_conf_t *)r->loc_conf[ngx_http_fastcgi_module.ctx_index];
  pnVar2 = ngx_http_fastcgi_split(r,flcf);
  nVar4 = -1;
  if (pnVar2 != (ngx_http_fastcgi_ctx_t *)0x0) {
    sVar1 = (pnVar2->script_name).len;
    if ((sVar1 == 0) || ((pnVar2->script_name).data[sVar1 - 1] != '/')) {
      *(uint *)v = (*(uint *)v & 0x80000000) + ((uint)sVar1 & 0xfffffff) + 0x10000000;
      v->data = (pnVar2->script_name).data;
    }
    else {
      uVar3 = (uint)sVar1 + (int)(flcf->index).len & 0xfffffff;
      *(uint *)v = *(uint *)v & 0xf0000000 | uVar3;
      __dest = (u_char *)ngx_pnalloc(r->pool,(ulong)uVar3);
      v->data = __dest;
      if (__dest == (u_char *)0x0) {
        return -1;
      }
      memcpy(__dest,(pnVar2->script_name).data,(pnVar2->script_name).len);
      memcpy(__dest + (pnVar2->script_name).len,(flcf->index).data,(flcf->index).len);
    }
    nVar4 = 0;
  }
  return nVar4;
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_script_name_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char                       *p;
    ngx_http_fastcgi_ctx_t       *f;
    ngx_http_fastcgi_loc_conf_t  *flcf;

    flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

    f = ngx_http_fastcgi_split(r, flcf);

    if (f == NULL) {
        return NGX_ERROR;
    }

    if (f->script_name.len == 0
        || f->script_name.data[f->script_name.len - 1] != '/')
    {
        v->len = f->script_name.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = f->script_name.data;

        return NGX_OK;
    }

    v->len = f->script_name.len + flcf->index.len;

    v->data = ngx_pnalloc(r->pool, v->len);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    p = ngx_copy(v->data, f->script_name.data, f->script_name.len);
    ngx_memcpy(p, flcf->index.data, flcf->index.len);

    return NGX_OK;
}